

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrFoveationConfigurationHTC *value)

{
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *command_name_00;
  string *instance_info_00;
  bool bVar1;
  string local_298 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_278;
  allocator local_259;
  string local_258 [32];
  string local_238 [32];
  ostringstream local_218 [8];
  ostringstream oss_enum;
  allocator local_99;
  string local_98 [55];
  allocator local_61;
  string local_60 [36];
  XrResult local_3c;
  XrFoveationConfigurationHTC *pXStack_38;
  XrResult xr_result;
  XrFoveationConfigurationHTC *value_local;
  bool check_pnext_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *pvStack_28;
  bool check_members_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *objects_info_local;
  string *command_name_local;
  GenValidUsageXrInstanceInfo *instance_info_local;
  
  local_3c = XR_SUCCESS;
  if (check_members) {
    pXStack_38 = value;
    value_local._6_1_ = check_pnext;
    value_local._7_1_ = check_members;
    pvStack_28 = objects_info;
    objects_info_local =
         (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
         command_name;
    command_name_local = (string *)instance_info;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"XrFoveationConfigurationHTC",&local_61);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"level",&local_99);
    bVar1 = ValidateXrEnum(instance_info,command_name,(string *)local_60,(string *)local_98,
                           pvStack_28,pXStack_38->level);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      instance_info_local._4_4_ = local_3c;
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_218);
      std::operator<<((ostream *)local_218,
                      "XrFoveationConfigurationHTC contains invalid XrFoveationLevelHTC \"level\" enum value "
                     );
      Uint32ToHexString_abi_cxx11_((uint32_t)local_238);
      std::operator<<((ostream *)local_218,local_238);
      std::__cxx11::string::~string(local_238);
      instance_info_00 = command_name_local;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_258,"VUID-XrFoveationConfigurationHTC-level-parameter",&local_259);
      command_name_00 = objects_info_local;
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_278,pvStack_28);
      std::__cxx11::ostringstream::str();
      CoreValidLogMessage((GenValidUsageXrInstanceInfo *)instance_info_00,(string *)local_258,
                          VALID_USAGE_DEBUG_SEVERITY_ERROR,(string *)command_name_00,&local_278,
                          local_298);
      std::__cxx11::string::~string((string *)local_298);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_278);
      std::__cxx11::string::~string(local_258);
      std::allocator<char>::~allocator((allocator<char> *)&local_259);
      instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      std::__cxx11::ostringstream::~ostringstream(local_218);
    }
  }
  else {
    instance_info_local._4_4_ = XR_SUCCESS;
  }
  return instance_info_local._4_4_;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrFoveationConfigurationHTC* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Make sure the enum type XrFoveationLevelHTC value is valid
    if (!ValidateXrEnum(instance_info, command_name, "XrFoveationConfigurationHTC", "level", objects_info, value->level)) {
        std::ostringstream oss_enum;
        oss_enum << "XrFoveationConfigurationHTC contains invalid XrFoveationLevelHTC \"level\" enum value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->level));
        CoreValidLogMessage(instance_info, "VUID-XrFoveationConfigurationHTC-level-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Everything checked out properly
    return xr_result;
}